

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O2

void deqp::gles3::Functional::evalTexture2DShadowGradOffset(ShaderEvalContext *c,TexLookupParams *p)

{
  float s;
  float t;
  float lod;
  float fVar1;
  IVec2 local_18;
  
  fVar1 = c->in[0].m_data[2];
  s = c->in[0].m_data[0];
  t = c->in[0].m_data[1];
  lod = computeLodFromGrad2D(c);
  local_18.m_data = *(int (*) [2])(p->offset).m_data;
  fVar1 = texture2DShadowOffset(c,fVar1,s,t,lod,&local_18);
  (c->color).m_data[0] = fVar1;
  return;
}

Assistant:

static void		evalTexture2DShadowGradOffset		(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture2DShadowOffset(c, c.in[0].z(), c.in[0].x(), c.in[0].y(), computeLodFromGrad2D(c), p.offset.swizzle(0,1)); }